

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

long duckdb::BinaryLambdaWrapper::
     Operation<duckdb::LevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
               (anon_class_8_1_6971b95b fun,string_t left,string_t right,ValidityMask *mask,
               idx_t idx)

{
  size_type __n;
  size_type __n_00;
  char cVar1;
  char cVar2;
  value_type vVar3;
  reference pvVar4;
  uint uVar5;
  size_type __n_01;
  value_type vVar6;
  ulong uVar7;
  idx_t pos_tgt;
  size_type sVar8;
  ulong uVar9;
  value_type vVar10;
  vector<unsigned_long,_true> distances1;
  vector<unsigned_long,_true> distances0;
  allocator_type local_b9;
  long local_b8;
  long local_b0;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_90;
  value_type local_78;
  value_type local_70;
  ulong local_68;
  value_type local_60;
  value_type_conflict1 local_58;
  undefined8 local_50;
  long local_48;
  undefined8 local_40;
  long local_38;
  
  local_48 = right.value._0_8_;
  local_50 = left.value._8_8_;
  local_38 = left.value._0_8_;
  uVar5 = left.value._8_4_;
  __n_01 = (size_type)uVar5;
  vVar6 = __n_01;
  if (((uint)fun.result != 0) && (vVar6 = (ulong)fun.result & 0xffffffff, uVar5 != 0)) {
    local_b8 = local_38;
    if ((uint)fun.result < 0xd) {
      local_b8 = (long)&local_40 + 4;
    }
    local_b0 = local_48;
    if (uVar5 < 0xd) {
      local_b0 = (long)&local_50 + 4;
    }
    __n = __n_01 + 1;
    local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_40 = fun.result;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_90,__n,
               (value_type_conflict1 *)&local_a8,(allocator_type *)&local_58);
    local_58 = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a8,__n,&local_58,
               &local_b9);
    for (sVar8 = 0; __n != sVar8; sVar8 = sVar8 + 1) {
      pvVar4 = vector<unsigned_long,_true>::get<true>
                         ((vector<unsigned_long,_true> *)&local_90,sVar8);
      *pvVar4 = sVar8;
    }
    vVar10 = 0;
    local_78 = vVar6;
    local_68 = __n_01;
    while (vVar10 != local_78) {
      pvVar4 = vector<unsigned_long,_true>::get<true>((vector<unsigned_long,_true> *)&local_a8,0);
      local_70 = vVar10 + 1;
      *pvVar4 = local_70;
      sVar8 = 0;
      local_60 = vVar10;
      while (__n_01 != sVar8) {
        __n_00 = sVar8 + 1;
        pvVar4 = vector<unsigned_long,_true>::get<true>
                           ((vector<unsigned_long,_true> *)&local_90,__n_00);
        vVar6 = *pvVar4;
        pvVar4 = vector<unsigned_long,_true>::get<true>
                           ((vector<unsigned_long,_true> *)&local_a8,sVar8);
        vVar10 = *pvVar4;
        pvVar4 = vector<unsigned_long,_true>::get<true>
                           ((vector<unsigned_long,_true> *)&local_90,sVar8);
        vVar3 = *pvVar4;
        cVar1 = *(char *)(local_b8 + local_60);
        cVar2 = *(char *)(local_b0 + sVar8);
        pvVar4 = vector<unsigned_long,_true>::get<true>
                           ((vector<unsigned_long,_true> *)&local_a8,__n_00);
        uVar7 = vVar3 + (cVar1 != cVar2);
        uVar9 = vVar10 + 1;
        if (uVar7 < vVar10 + 1) {
          uVar9 = uVar7;
        }
        if (vVar6 + 1 < uVar9) {
          uVar9 = vVar6 + 1;
        }
        *pvVar4 = uVar9;
        __n_01 = local_68;
        sVar8 = __n_00;
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_90,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a8);
      vVar10 = local_70;
    }
    pvVar4 = vector<unsigned_long,_true>::get<true>((vector<unsigned_long,_true> *)&local_90,__n_01)
    ;
    vVar6 = *pvVar4;
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_a8);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_90);
  }
  return vVar6;
}

Assistant:

static inline RESULT_TYPE Operation(FUNC fun, LEFT_TYPE left, RIGHT_TYPE right, ValidityMask &mask, idx_t idx) {
		return fun(left, right);
	}